

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_dispatch_overridable_method(writer *w,MethodDef *method)

{
  bool bVar1;
  anon_class_8_1_89897ddb_conflict1 local_1a0;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  anon_class_8_1_89897ddb_conflict1 local_188;
  basic_string_view<char,_std::char_traits<char>_> local_180;
  char *local_170;
  anon_class_8_1_89897ddb_conflict1 local_168 [3];
  basic_string_view<char,_std::char_traits<char>_> local_150;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  undefined1 local_130 [8];
  method_signature signature;
  char *format;
  MethodDef *method_local;
  writer *w_local;
  
  signature.m_return.super_row_base<winmd::reader::Param>._8_8_ = anon_var_dwarf_9db60;
  method_signature::method_signature((method_signature *)local_130,method);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_140,(char *)signature.m_return.super_row_base<winmd::reader::Param>._8_8_);
  local_150 = get_name(method);
  local_168[0] = bind<&cppwinrt::write_implementation_params,_cppwinrt::method_signature_&>
                           ((method_signature *)local_130);
  bVar1 = is_noexcept(method);
  local_170 = "";
  if (bVar1) {
    local_170 = " noexcept";
  }
  local_180 = get_name(method);
  local_188 = bind<&cppwinrt::write_consume_args,_cppwinrt::method_signature_&>
                        ((method_signature *)local_130);
  local_198 = get_name(method);
  local_1a0 = bind<&cppwinrt::write_consume_args,_cppwinrt::method_signature_&>
                        ((method_signature *)local_130);
  writer_base<cppwinrt::writer>::
  write<std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_const_char_*,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
            (&w->super_writer_base<cppwinrt::writer>,&local_140,&local_150,local_168,&local_170,
             &local_180,&local_188,&local_198,&local_1a0);
  method_signature::~method_signature((method_signature *)local_130);
  return;
}

Assistant:

static void write_dispatch_overridable_method(writer& w, MethodDef const& method)
    {
        auto format = R"(    auto %(%)%
    {
        if (auto overridable = this->shim_overridable())
        {
            return overridable.%(%);
        }

        return this->shim().%(%);
    }
)";

        method_signature signature{ method };

        w.write(format,
            get_name(method),
            bind<write_implementation_params>(signature),
            is_noexcept(method) ? " noexcept" : "",
            get_name(method),
            bind<write_consume_args>(signature),
            get_name(method),
            bind<write_consume_args>(signature));
    }